

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionEvaluator.cpp
# Opt level: O0

void __thiscall OpenMD::SelectionEvaluator::define(SelectionEvaluator *this)

{
  value_type *in_RDI;
  pair<std::_Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>,_bool>
  pVar1;
  string variable;
  int in_stack_000001ac;
  vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *in_stack_000001b0;
  SelectionEvaluator *in_stack_000001b8;
  _Storage *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__x;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  *in_stack_ffffffffffffff70;
  string local_28 [40];
  
  this_00 = (_Storage *)&in_RDI[10].first._M_string_length;
  std::vector<OpenMD::Token,_std::allocator<OpenMD::Token>_>::operator[]
            ((vector<OpenMD::Token,_std::allocator<OpenMD::Token>_> *)this_00,1);
  std::any_cast<std::__cxx11::string>((any *)in_RDI);
  __x = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&in_RDI[0x1a].second;
  expression(in_stack_000001b8,in_stack_000001b0,in_stack_000001ac);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_&,_OpenMD::SelectionSet,_true>
            (in_stack_ffffffffffffff70,__x,(SelectionSet *)this_00);
  pVar1 = std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
          ::insert((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>_>_>
                    *)this_00,in_RDI);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
  ::~pair((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::any>
           *)pVar1.first._M_node._M_node);
  SelectionSet::~SelectionSet((SelectionSet *)0x2724c8);
  std::__cxx11::string::~string(local_28);
  return;
}

Assistant:

void SelectionEvaluator::define() {
    assert(statement.size() >= 3);

    std::string variable = std::any_cast<std::string>(statement[1].value);

    variables.insert(
        VariablesType::value_type(variable, expression(statement, 2)));
  }